

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O3

void cp_decl_func(CPState *cp,CPDecl *fdecl)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  CTypeID CVar4;
  CTypeID CVar5;
  CTypeID CVar6;
  CPDeclIdx CVar7;
  int iVar8;
  CTSize size;
  CTInfo info;
  CTState *cts;
  uint uVar9;
  CTypeID1 CVar10;
  CTypeID CVar11;
  CType *ct;
  CPDecl decl;
  CType *local_9d8;
  CPDecl local_9d0;
  
  if (cp->tok == 0x29) {
    CVar10 = 0;
    uVar9 = 0x60000000;
    size = 0;
  }
  else {
    CVar11 = 0;
    size = 0;
    if (cp->tok != 0x2e) {
      size = 0;
      CVar11 = 0;
      uVar9 = 0;
      do {
        cp_decl_spec(cp,&local_9d0,0x80000);
        local_9d0.mode = 6;
        cp_declarator(cp,&local_9d0);
        CVar5 = cp_decl_intern(cp,&local_9d0);
        cts = cp->cts;
        uVar2 = cts->tab[CVar5].info;
        local_9d8 = cts->tab + CVar5;
        if (uVar2 >> 0x1c == 4) {
          uVar9 = 0x60000000;
          goto LAB_0014bcf5;
        }
        if ((uVar2 & 0xfc000000) == 0x30000000) {
          info = uVar2 & 0xffff | 0x20030000;
LAB_0014bc35:
          CVar5 = lj_ctype_intern(cts,info,8);
          cts = cp->cts;
        }
        else if (uVar2 >> 0x1c == 6) {
          info = (CVar5 | 0x30000) + 0x20000000;
          goto LAB_0014bc35;
        }
        CVar6 = lj_ctype_new(cts,&local_9d8);
        CVar4 = CVar6;
        if (CVar11 != 0) {
          cp->cts->tab[uVar9].sib = (CTypeID1)CVar6;
          CVar4 = CVar11;
        }
        CVar11 = CVar4;
        if (local_9d0.name != (GCstr *)0x0) {
          (local_9d0.name)->marked = (local_9d0.name)->marked | 0x20;
          (local_9d8->name).gcptr64 = (uint64_t)local_9d0.name;
        }
        local_9d8->info = CVar5 + 0x90000000;
        local_9d8->size = size;
        size = size + 1;
        if (cp->tok != 0x2c) {
          uVar9 = 0x60000000;
          goto LAB_0014bcf5;
        }
        cp_next(cp);
        uVar9 = CVar6;
      } while (cp->tok != 0x2e);
    }
    cp_next(cp);
    cp_check(cp,0x2e);
    cp_check(cp,0x2e);
    uVar9 = 0x60800000;
LAB_0014bcf5:
    CVar10 = (CTypeID1)CVar11;
  }
  cp_check(cp,0x29);
  if (cp->tok == 0x7b) {
    cp_next(cp);
    *(byte *)&cp->mode = (byte)cp->mode | 0x20;
    iVar8 = 1;
    do {
      iVar3 = cp->tok;
      if (iVar3 == 0x7b) {
        iVar8 = iVar8 + 1;
      }
      else if (iVar3 == 0x7d) {
        iVar8 = iVar8 + -1;
        if (iVar8 == 0) {
          *(byte *)&cp->mode = (byte)cp->mode & 0xdf;
          cp->tok = 0x3b;
          break;
        }
      }
      else if (iVar3 == 0x103) {
        cp_err_token(cp,0x7d);
      }
      cp_next(cp);
    } while( true );
  }
  uVar1 = *(ushort *)((long)&fdecl->fattr + 2);
  fdecl->fattr = 0;
  CVar7 = cp_add(fdecl,(uint)uVar1 << 0x10 | uVar9,size);
  fdecl->stack[CVar7].sib = CVar10;
  return;
}

Assistant:

static void cp_decl_func(CPState *cp, CPDecl *fdecl)
{
  CTSize nargs = 0;
  CTInfo info = CTINFO(CT_FUNC, 0);
  CTypeID lastid = 0, anchor = 0;
  if (cp->tok != ')') {
    do {
      CPDecl decl;
      CTypeID ctypeid, fieldid;
      CType *ct;
      if (cp_opt(cp, '.')) {  /* Vararg function. */
	cp_check(cp, '.');  /* Workaround for the minimalistic lexer. */
	cp_check(cp, '.');
	info |= CTF_VARARG;
	break;
      }
      cp_decl_spec(cp, &decl, CDF_REGISTER);
      decl.mode = CPARSE_MODE_DIRECT|CPARSE_MODE_ABSTRACT;
      cp_declarator(cp, &decl);
      ctypeid = cp_decl_intern(cp, &decl);
      ct = ctype_raw(cp->cts, ctypeid);
      if (ctype_isvoid(ct->info))
	break;
      else if (ctype_isrefarray(ct->info))
	ctypeid = lj_ctype_intern(cp->cts,
	  CTINFO(CT_PTR, CTALIGN_PTR|ctype_cid(ct->info)), CTSIZE_PTR);
      else if (ctype_isfunc(ct->info))
	ctypeid = lj_ctype_intern(cp->cts,
	  CTINFO(CT_PTR, CTALIGN_PTR|ctypeid), CTSIZE_PTR);
      /* Add new parameter. */
      fieldid = lj_ctype_new(cp->cts, &ct);
      if (anchor)
	ctype_get(cp->cts, lastid)->sib = fieldid;
      else
	anchor = fieldid;
      lastid = fieldid;
      if (decl.name) ctype_setname(ct, decl.name);
      ct->info = CTINFO(CT_FIELD, ctypeid);
      ct->size = nargs++;
    } while (cp_opt(cp, ','));
  }
  cp_check(cp, ')');
  if (cp_opt(cp, '{')) {  /* Skip function definition. */
    int level = 1;
    cp->mode |= CPARSE_MODE_SKIP;
    for (;;) {
      if (cp->tok == '{') level++;
      else if (cp->tok == '}' && --level == 0) break;
      else if (cp->tok == CTOK_EOF) cp_err_token(cp, '}');
      cp_next(cp);
    }
    cp->mode &= ~CPARSE_MODE_SKIP;
    cp->tok = ';';  /* Ok for cp_decl_multi(), error in cp_decl_single(). */
  }
  info |= (fdecl->fattr & ~CTMASK_CID);
  fdecl->fattr = 0;
  fdecl->stack[cp_add(fdecl, info, nargs)].sib = anchor;
}